

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_tests.cpp
# Opt level: O1

void sock_tests::SendAndRecvMessage(Sock *sender,Sock *receiver)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  undefined4 local_154;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  long local_110;
  lazy_ostream local_108;
  undefined1 *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  ssize_t msg_len;
  ssize_t *local_c0;
  undefined **local_b8;
  undefined1 local_b0;
  undefined1 *local_a8;
  ssize_t **local_a0;
  long *local_98;
  undefined **local_90;
  undefined1 local_88;
  undefined1 *local_80;
  long **local_78;
  char *local_70;
  char *local_68;
  assertion_result local_60;
  char recv_buf [10];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  msg_len = 4;
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x61;
  file.m_begin = (iterator)&local_d8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_e8,msg);
  local_108.m_empty = false;
  local_108._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = "";
  iVar2 = (*sender->_vptr_Sock[3])(sender,"abcd",4,0);
  local_110 = CONCAT44(extraout_var,iVar2);
  local_98 = &local_110;
  local_c0 = &msg_len;
  local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_110 == msg_len);
  local_60.m_message.px = (element_type *)0x0;
  local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_68 = "";
  local_78 = &local_98;
  local_88 = 0;
  local_90 = &PTR__lazy_ostream_013d4050;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_a0 = &local_c0;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_013d4050;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_60,&local_108,1,2,REQUIRE,0xf6aa85,(size_t)&local_70,0x61,&local_90,"msg_len",
             &local_b8);
  boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x62;
  file_00.m_begin = (iterator)&local_120;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_130,
             msg_00);
  local_108.m_empty = false;
  local_108._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = "";
  iVar2 = (*receiver->_vptr_Sock[4])(receiver,recv_buf,10,0);
  local_110 = CONCAT44(extraout_var_00,iVar2);
  local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_110 == msg_len);
  local_60.m_message.px = (element_type *)0x0;
  local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_68 = "";
  local_98 = &local_110;
  local_88 = 0;
  local_90 = &PTR__lazy_ostream_013d4050;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = &local_98;
  local_c0 = &msg_len;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_013d4050;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = &local_c0;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_60,&local_108,1,2,REQUIRE,0xf6aaaa,(size_t)&local_70,0x62,&local_90,"msg_len",
             &local_b8);
  boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x63;
  file_01.m_begin = (iterator)&local_140;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_150,
             msg_01);
  local_108.m_empty = false;
  local_108._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = "";
  iVar2 = strncmp("abcd",recv_buf,4);
  local_110 = CONCAT44(local_110._4_4_,iVar2);
  local_c0 = (ssize_t *)&local_154;
  local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_154 = 0;
  local_60.m_message.px = (element_type *)0x0;
  local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_68 = "";
  local_98 = &local_110;
  local_88 = 0;
  local_90 = &PTR__lazy_ostream_013d3e70;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = &local_98;
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_013d3e70;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = &local_c0;
  boost::test_tools::tt_detail::report_assertion
            (&local_60,&local_108,1,2,REQUIRE,0xf6aad7,(size_t)&local_70,99,&local_90,"0",&local_b8)
  ;
  boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SendAndRecvMessage(const Sock& sender, const Sock& receiver)
{
    const char* msg = "abcd";
    constexpr ssize_t msg_len = 4;
    char recv_buf[10];

    BOOST_CHECK_EQUAL(sender.Send(msg, msg_len, 0), msg_len);
    BOOST_CHECK_EQUAL(receiver.Recv(recv_buf, sizeof(recv_buf), 0), msg_len);
    BOOST_CHECK_EQUAL(strncmp(msg, recv_buf, msg_len), 0);
}